

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_test.cc
# Opt level: O1

void __thiscall MD5Test_ABI_Test::TestBody(MD5Test_ABI_Test *this)

{
  MD5_CTX ctx;
  
  MD5_Init((MD5_CTX *)&ctx);
  abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
            ("md5_block_asm_data_order, ctx.h, kBuf, 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/md5/md5_test.cc"
             ,0x1d,true,md5_block_asm_data_order,(Type)&ctx,"",1);
  abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
            ("md5_block_asm_data_order, ctx.h, kBuf, 2",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/md5/md5_test.cc"
             ,0x1e,true,md5_block_asm_data_order,(Type)&ctx,"",2);
  abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
            ("md5_block_asm_data_order, ctx.h, kBuf, 4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/md5/md5_test.cc"
             ,0x1f,true,md5_block_asm_data_order,(Type)&ctx,"",4);
  abi_test::internal::CheckGTest<void,unsigned_int*,unsigned_char_const*,unsigned_long>
            ("md5_block_asm_data_order, ctx.h, kBuf, 8",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/md5/md5_test.cc"
             ,0x20,true,md5_block_asm_data_order,(Type)&ctx,"",8);
  return;
}

Assistant:

TEST(MD5Test, ABI) {
  MD5_CTX ctx;
  MD5_Init(&ctx);

  static const uint8_t kBuf[MD5_CBLOCK * 8] = {0};
  CHECK_ABI(md5_block_asm_data_order, ctx.h, kBuf, 1);
  CHECK_ABI(md5_block_asm_data_order, ctx.h, kBuf, 2);
  CHECK_ABI(md5_block_asm_data_order, ctx.h, kBuf, 4);
  CHECK_ABI(md5_block_asm_data_order, ctx.h, kBuf, 8);
}